

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O2

vector2D<basisu::pvrtc4_block> * __thiscall
basisu::vector2D<basisu::pvrtc4_block>::operator=
          (vector2D<basisu::pvrtc4_block> *this,vector2D<basisu::pvrtc4_block> *other)

{
  if (this != other) {
    this->m_width = other->m_width;
    this->m_height = other->m_height;
    vector<basisu::pvrtc4_block>::operator=(&this->m_values,&other->m_values);
  }
  return this;
}

Assistant:

vector2D &operator= (const vector2D &other)
		{
			if (this != &other)
			{
				m_width = other.m_width;
				m_height = other.m_height;
				m_values = other.m_values;
			}
			return *this;
		}